

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O1

void anon_unknown.dwarf_5bc4ae8::sha512::Transform(uint64_t *s,uchar *chunk)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *s;
  uVar3 = s[1];
  uVar4 = s[2];
  uVar5 = s[4];
  uVar6 = s[5];
  uVar7 = *(ulong *)chunk;
  uVar26 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
           (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  uVar7 = s[6];
  lVar38 = uVar26 + 0x428a2f98d728ae22 +
           ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + s[7] +
           ((uVar5 << 0x17 | uVar5 >> 0x29) ^
           (uVar5 << 0x2e | uVar5 >> 0x12) ^ (uVar5 << 0x32 | uVar5 >> 0xe));
  uVar37 = *(ulong *)(chunk + 8);
  uVar27 = ((uVar3 | uVar2) & uVar4 | uVar3 & uVar2) +
           ((uVar2 << 0x19 | uVar2 >> 0x27) ^
           (uVar2 << 0x1e | uVar2 >> 0x22) ^ (uVar2 << 0x24 | uVar2 >> 0x1c)) + lVar38;
  uVar15 = uVar37 >> 0x38;
  uVar10 = uVar15 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar39 = lVar38 + s[3];
  lVar38 = ((uVar6 ^ uVar5) & uVar39 ^ uVar6) + uVar10 + uVar7 + 0x7137449123ef65cd +
           ((uVar39 * 0x800000 | uVar39 >> 0x29) ^
           (uVar39 << 0x2e | uVar39 >> 0x12) ^ (uVar39 << 0x32 | uVar39 >> 0xe));
  uVar8 = ((uVar27 | uVar2) & uVar3 | uVar27 & uVar2) +
          ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
          (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x10);
  uVar17 = uVar37 >> 0x38;
  uVar11 = uVar17 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar30 = lVar38 + uVar4;
  lVar38 = ((uVar39 ^ uVar5) & uVar30 ^ uVar5) + uVar6 + uVar11 + -0x4a3f043013b2c4d1 +
           ((uVar30 * 0x800000 | uVar30 >> 0x29) ^
           (uVar30 << 0x2e | uVar30 >> 0x12) ^ (uVar30 << 0x32 | uVar30 >> 0xe));
  uVar16 = ((uVar8 | uVar27) & uVar2 | uVar8 & uVar27) +
           ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
           (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x18);
  uVar34 = uVar37 >> 0x38;
  uVar12 = uVar34 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar35 = lVar38 + uVar3;
  lVar38 = ((uVar30 ^ uVar39) & uVar35 ^ uVar39) + uVar5 + uVar12 + -0x164a245a7e762444 +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar13 = ((uVar16 | uVar8) & uVar27 | uVar16 & uVar8) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x20);
  uVar20 = uVar37 >> 0x38;
  uVar18 = uVar20 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar42 = lVar38 + uVar2;
  lVar38 = uVar39 + uVar18 + ((uVar35 ^ uVar30) & uVar42 ^ uVar30) + 0x3956c25bf348b538 +
           ((uVar42 * 0x800000 | uVar42 >> 0x29) ^
           (uVar42 << 0x2e | uVar42 >> 0x12) ^ (uVar42 << 0x32 | uVar42 >> 0xe));
  uVar27 = uVar27 + lVar38;
  uVar40 = ((uVar13 | uVar16) & uVar8 | uVar13 & uVar16) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x28);
  uVar39 = uVar37 >> 0x38;
  uVar48 = uVar39 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar30 + uVar48 + ((uVar42 ^ uVar35) & uVar27 ^ uVar35) + 0x59f111f1b605d019 +
           ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
           (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
  uVar8 = uVar8 + lVar38;
  uVar31 = ((uVar40 | uVar13) & uVar16 | uVar40 & uVar13) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x30);
  uVar30 = uVar37 >> 0x38;
  uVar49 = uVar30 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar35 + uVar49 + ((uVar27 ^ uVar42) & uVar8 ^ uVar42) + -0x6dc07d5b50e6b065 +
           ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
           (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar36 = ((uVar31 | uVar40) & uVar13 | uVar31 & uVar40) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x38);
  uVar35 = uVar37 >> 0x38;
  uVar50 = uVar35 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar42 + uVar50 + ((uVar8 ^ uVar27) & uVar16 ^ uVar27) + -0x54e3a12a25927ee8 +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar37 = *(ulong *)(chunk + 0x40);
  uVar42 = uVar37 >> 0x38;
  uVar22 = uVar42 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar13 = uVar13 + lVar38;
  uVar19 = ((uVar36 | uVar31) & uVar40 | uVar36 & uVar31) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar38;
  lVar38 = uVar27 + uVar22 + ((uVar16 ^ uVar8) & uVar13 ^ uVar8) + -0x27f855675cfcfdbe +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar40 = uVar40 + lVar38;
  uVar28 = ((uVar19 | uVar36) & uVar31 | uVar19 & uVar36) +
           ((uVar19 * 0x2000000 | uVar19 >> 0x27) ^
           (uVar19 * 0x40000000 | uVar19 >> 0x22) ^ (uVar19 << 0x24 | uVar19 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x48);
  uVar27 = uVar37 >> 0x38;
  uVar23 = uVar27 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar8 + uVar23 + ((uVar13 ^ uVar16) & uVar40 ^ uVar16) + 0x12835b0145706fbe +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar31 = uVar31 + lVar38;
  uVar9 = ((uVar28 | uVar19) & uVar36 | uVar28 & uVar19) +
          ((uVar28 * 0x2000000 | uVar28 >> 0x27) ^
          (uVar28 * 0x40000000 | uVar28 >> 0x22) ^ (uVar28 << 0x24 | uVar28 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x50);
  uVar25 = uVar37 >> 0x38;
  uVar24 = uVar25 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar16 + uVar24 + ((uVar40 ^ uVar13) & uVar31 ^ uVar13) + 0x243185be4ee4b28c +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar36 = uVar36 + lVar38;
  uVar46 = ((uVar9 | uVar28) & uVar19 | uVar9 & uVar28) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x58);
  uVar16 = uVar37 >> 0x38;
  uVar43 = uVar16 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar13 + uVar43 + ((uVar31 ^ uVar40) & uVar36 ^ uVar40) + 0x550c7dc3d5ffb4e2 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar37 = *(ulong *)(chunk + 0x60);
  uVar13 = uVar37 >> 0x38;
  uVar14 = uVar13 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  uVar19 = uVar19 + lVar38;
  uVar47 = ((uVar46 | uVar9) & uVar28 | uVar46 & uVar9) +
           ((uVar46 * 0x2000000 | uVar46 >> 0x27) ^
           (uVar46 * 0x40000000 | uVar46 >> 0x22) ^ (uVar46 << 0x24 | uVar46 >> 0x1c)) + lVar38;
  lVar38 = uVar40 + uVar14 + ((uVar36 ^ uVar31) & uVar19 ^ uVar31) + 0x72be5d74f27b896f +
           ((uVar19 * 0x800000 | uVar19 >> 0x29) ^
           (uVar19 << 0x2e | uVar19 >> 0x12) ^ (uVar19 << 0x32 | uVar19 >> 0xe));
  uVar28 = uVar28 + lVar38;
  uVar51 = ((uVar47 | uVar46) & uVar9 | uVar47 & uVar46) +
           ((uVar47 * 0x2000000 | uVar47 >> 0x27) ^
           (uVar47 * 0x40000000 | uVar47 >> 0x22) ^ (uVar47 << 0x24 | uVar47 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x68);
  uVar40 = uVar37 >> 0x38;
  uVar41 = uVar40 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18 |
           (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
           (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar31 + uVar41 + ((uVar19 ^ uVar36) & uVar28 ^ uVar36) + -0x7f214e01c4e9694f +
           ((uVar28 * 0x800000 | uVar28 >> 0x29) ^
           (uVar28 << 0x2e | uVar28 >> 0x12) ^ (uVar28 << 0x32 | uVar28 >> 0xe));
  uVar9 = uVar9 + lVar38;
  uVar44 = ((uVar51 | uVar47) & uVar46 | uVar51 & uVar47) +
           ((uVar51 * 0x2000000 | uVar51 >> 0x27) ^
           (uVar51 * 0x40000000 | uVar51 >> 0x22) ^ (uVar51 << 0x24 | uVar51 >> 0x1c)) + lVar38;
  uVar37 = *(ulong *)(chunk + 0x70);
  uVar31 = uVar37 >> 0x38;
  uVar21 = uVar31 | (uVar37 & 0xff000000000000) >> 0x28 | (uVar37 & 0xff0000000000) >> 0x18;
  uVar45 = uVar21 | (uVar37 & 0xff00000000) >> 8 | (uVar37 & 0xff000000) << 8 |
           (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38;
  lVar38 = uVar36 + uVar45 + ((uVar28 ^ uVar19) & uVar9 ^ uVar19) + -0x6423f958da38edcb +
           ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
           (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar46 = uVar46 + lVar38;
  uVar32 = ((uVar44 | uVar51) & uVar47 | uVar44 & uVar51) +
           ((uVar44 * 0x2000000 | uVar44 >> 0x27) ^
           (uVar44 * 0x40000000 | uVar44 >> 0x22) ^ (uVar44 << 0x24 | uVar44 >> 0x1c)) + lVar38;
  uVar8 = *(ulong *)(chunk + 0x78);
  uVar36 = uVar8 >> 0x38;
  uVar29 = uVar36 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18;
  uVar33 = uVar29 | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
           (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  lVar38 = uVar19 + uVar33 + ((uVar9 ^ uVar28) & uVar46 ^ uVar28) + -0x3e640e8b3096d96c +
           ((uVar46 * 0x800000 | uVar46 >> 0x29) ^
           (uVar46 << 0x2e | uVar46 >> 0x12) ^ (uVar46 << 0x32 | uVar46 >> 0xe));
  uVar47 = uVar47 + lVar38;
  uVar19 = ((uVar32 | uVar44) & uVar51 | uVar32 & uVar44) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar38;
  uVar21 = uVar26 + uVar23 +
           (uVar10 >> 7 ^
           (uVar15 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           (uVar45 >> 6 ^
           (uVar45 << 3 | (uVar37 << 0x38) >> 0x3d) ^ (uVar21 << 0x2d | uVar45 >> 0x13));
  lVar38 = uVar28 + uVar21 + ((uVar46 ^ uVar9) & uVar47 ^ uVar9) + -0x1b64963e610eb52e +
           ((uVar47 * 0x800000 | uVar47 >> 0x29) ^
           (uVar47 << 0x2e | uVar47 >> 0x12) ^ (uVar47 << 0x32 | uVar47 >> 0xe));
  uVar51 = uVar51 + lVar38;
  uVar37 = ((uVar19 | uVar32) & uVar44 | uVar19 & uVar32) +
           ((uVar19 * 0x2000000 | uVar19 >> 0x27) ^
           (uVar19 * 0x40000000 | uVar19 >> 0x22) ^ (uVar19 << 0x24 | uVar19 >> 0x1c)) + lVar38;
  uVar8 = uVar10 + uVar24 +
          (uVar11 >> 7 ^
          (uVar17 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
          (uVar33 >> 6 ^ (uVar33 << 3 | (uVar8 << 0x38) >> 0x3d) ^ (uVar29 << 0x2d | uVar33 >> 0x13)
          );
  lVar38 = uVar9 + uVar8 + ((uVar47 ^ uVar46) & uVar51 ^ uVar46) + -0x1041b879c7b0da1d +
           ((uVar51 * 0x800000 | uVar51 >> 0x29) ^
           (uVar51 << 0x2e | uVar51 >> 0x12) ^ (uVar51 << 0x32 | uVar51 >> 0xe));
  uVar44 = uVar44 + lVar38;
  uVar10 = ((uVar37 | uVar19) & uVar32 | uVar37 & uVar19) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar29 = uVar11 + uVar43 +
           (uVar12 >> 7 ^
           (uVar34 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  lVar38 = uVar46 + uVar29 + ((uVar51 ^ uVar47) & uVar44 ^ uVar47) + 0xfc19dc68b8cd5b5 +
           ((uVar44 * 0x800000 | uVar44 >> 0x29) ^
           (uVar44 << 0x2e | uVar44 >> 0x12) ^ (uVar44 << 0x32 | uVar44 >> 0xe));
  uVar32 = uVar32 + lVar38;
  uVar26 = ((uVar10 | uVar37) & uVar19 | uVar10 & uVar37) +
           ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
           (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar38;
  uVar28 = uVar12 + uVar14 +
           (uVar18 >> 7 ^
           (uVar20 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           (uVar8 >> 6 ^ (uVar8 * 8 | uVar8 >> 0x3d) ^ (uVar8 << 0x2d | uVar8 >> 0x13));
  lVar38 = uVar47 + uVar28 + ((uVar44 ^ uVar51) & uVar32 ^ uVar51) + 0x240ca1cc77ac9c65 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar19 = uVar19 + lVar38;
  uVar17 = ((uVar26 | uVar10) & uVar37 | uVar26 & uVar10) +
           ((uVar26 * 0x2000000 | uVar26 >> 0x27) ^
           (uVar26 * 0x40000000 | uVar26 >> 0x22) ^ (uVar26 << 0x24 | uVar26 >> 0x1c)) + lVar38;
  uVar46 = uVar18 + uVar41 +
           (uVar48 >> 7 ^
           (uVar39 << 0x38 | uVar48 >> 8) ^ (uVar48 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  lVar38 = uVar51 + uVar46 + ((uVar32 ^ uVar44) & uVar19 ^ uVar44) + 0x2de92c6f592b0275 +
           ((uVar19 * 0x800000 | uVar19 >> 0x29) ^
           (uVar19 << 0x2e | uVar19 >> 0x12) ^ (uVar19 << 0x32 | uVar19 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar18 = ((uVar17 | uVar26) & uVar10 | uVar17 & uVar26) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar38;
  uVar15 = uVar48 + uVar45 +
           (uVar49 >> 7 ^
           (uVar30 << 0x38 | uVar49 >> 8) ^ (uVar49 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           (uVar28 >> 6 ^ (uVar28 * 8 | uVar28 >> 0x3d) ^ (uVar28 << 0x2d | uVar28 >> 0x13));
  lVar38 = uVar44 + uVar15 + ((uVar19 ^ uVar32) & uVar37 ^ uVar32) + 0x4a7484aa6ea6e483 +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar10 = uVar10 + lVar38;
  uVar34 = ((uVar18 | uVar17) & uVar26 | uVar18 & uVar17) +
           ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
           (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar38;
  uVar11 = uVar49 + uVar33 +
           (uVar50 >> 7 ^
           (uVar35 << 0x38 | uVar50 >> 8) ^ (uVar50 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
           (uVar46 >> 6 ^ (uVar46 * 8 | uVar46 >> 0x3d) ^ (uVar46 << 0x2d | uVar46 >> 0x13));
  lVar38 = uVar32 + uVar11 + ((uVar37 ^ uVar19) & uVar10 ^ uVar19) + 0x5cb0a9dcbd41fbd4 +
           ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
           (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
  uVar26 = uVar26 + lVar38;
  uVar9 = ((uVar34 | uVar18) & uVar17 | uVar34 & uVar18) +
          ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
          (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar38;
  uVar39 = (uVar22 >> 7 ^
           (uVar42 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar42 & 1) != 0) << 0x3f)) +
           uVar50 + uVar21 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  lVar38 = uVar19 + uVar39 + ((uVar10 ^ uVar37) & uVar26 ^ uVar37) + 0x76f988da831153b5 +
           ((uVar26 * 0x800000 | uVar26 >> 0x29) ^
           (uVar26 << 0x2e | uVar26 >> 0x12) ^ (uVar26 << 0x32 | uVar26 >> 0xe));
  uVar17 = uVar17 + lVar38;
  uVar20 = ((uVar9 | uVar34) & uVar18 | uVar9 & uVar34) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar38;
  uVar12 = (uVar23 >> 7 ^
           (uVar27 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar22 + uVar8 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  lVar38 = uVar37 + uVar12 + ((uVar26 ^ uVar10) & uVar17 ^ uVar10) + -0x67c1aead11992055 +
           ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
           (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar18 = uVar18 + lVar38;
  uVar19 = ((uVar20 | uVar9) & uVar34 | uVar20 & uVar9) +
           ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
           (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c)) + lVar38;
  uVar30 = (uVar24 >> 7 ^
           (uVar25 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar23 + uVar29 +
           (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13));
  lVar38 = uVar10 + uVar30 + ((uVar17 ^ uVar26) & uVar18 ^ uVar26) + -0x57ce3992d24bcdf0 +
           ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
           (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
  uVar34 = uVar34 + lVar38;
  uVar37 = ((uVar19 | uVar20) & uVar9 | uVar19 & uVar20) +
           ((uVar19 * 0x2000000 | uVar19 >> 0x27) ^
           (uVar19 * 0x40000000 | uVar19 >> 0x22) ^ (uVar19 << 0x24 | uVar19 >> 0x1c)) + lVar38;
  uVar22 = (uVar43 >> 7 ^
           (uVar16 << 0x38 | uVar43 >> 8) ^ (uVar43 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar24 + uVar28 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  lVar38 = uVar26 + uVar22 + ((uVar18 ^ uVar17) & uVar34 ^ uVar17) + -0x4ffcd8376704dec1 +
           ((uVar34 * 0x800000 | uVar34 >> 0x29) ^
           (uVar34 << 0x2e | uVar34 >> 0x12) ^ (uVar34 << 0x32 | uVar34 >> 0xe));
  uVar9 = uVar9 + lVar38;
  uVar10 = ((uVar37 | uVar19) & uVar20 | uVar37 & uVar19) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar23 = (uVar14 >> 7 ^
           (uVar13 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar43 + uVar46 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  lVar38 = uVar17 + uVar23 + ((uVar34 ^ uVar18) & uVar9 ^ uVar18) + -0x40a680384110f11c +
           ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
           (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar20 = uVar20 + lVar38;
  uVar16 = ((uVar10 | uVar37) & uVar19 | uVar10 & uVar37) +
           ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
           (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar38;
  uVar35 = (uVar41 >> 7 ^
           (uVar40 << 0x38 | uVar41 >> 8) ^ (uVar41 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
           uVar14 + uVar15 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  lVar38 = uVar18 + uVar35 + ((uVar9 ^ uVar34) & uVar20 ^ uVar34) + -0x391ff40cc257703e +
           ((uVar20 * 0x800000 | uVar20 >> 0x29) ^
           (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe));
  uVar19 = uVar19 + lVar38;
  uVar17 = ((uVar16 | uVar10) & uVar37 | uVar16 & uVar10) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar14 = (uVar45 >> 7 ^
           (uVar31 << 0x38 | uVar45 >> 8) ^ (uVar45 >> 1 | (ulong)((uVar31 & 1) != 0) << 0x3f)) +
           uVar41 + uVar11 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  lVar38 = uVar34 + uVar14 + ((uVar20 ^ uVar9) & uVar19 ^ uVar9) + -0x2a586eb86cf558db +
           ((uVar19 * 0x800000 | uVar19 >> 0x29) ^
           (uVar19 << 0x2e | uVar19 >> 0x12) ^ (uVar19 << 0x32 | uVar19 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar25 = ((uVar17 | uVar16) & uVar10 | uVar17 & uVar16) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar38;
  uVar42 = (uVar33 >> 7 ^
           (uVar36 << 0x38 | uVar33 >> 8) ^ (uVar33 >> 1 | (ulong)((uVar36 & 1) != 0) << 0x3f)) +
           uVar45 + uVar39 +
           (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
  lVar38 = uVar9 + uVar42 + ((uVar19 ^ uVar20) & uVar37 ^ uVar20) + 0x6ca6351e003826f +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar10 = uVar10 + lVar38;
  uVar36 = ((uVar25 | uVar17) & uVar16 | uVar25 & uVar17) +
           ((uVar25 * 0x2000000 | uVar25 >> 0x27) ^
           (uVar25 * 0x40000000 | uVar25 >> 0x22) ^ (uVar25 << 0x24 | uVar25 >> 0x1c)) + lVar38;
  uVar34 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar33 + uVar12 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  lVar38 = uVar20 + uVar34 + ((uVar37 ^ uVar19) & uVar10 ^ uVar19) + 0x142929670a0e6e70 +
           ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
           (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar40 = ((uVar36 | uVar25) & uVar17 | uVar36 & uVar25) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar38;
  uVar27 = (uVar8 >> 7 ^
           (uVar8 << 0x38 | uVar8 >> 8) ^ (uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f)) + uVar21
           + uVar30 +
           (uVar42 >> 6 ^ (uVar42 * 8 | uVar42 >> 0x3d) ^ (uVar42 << 0x2d | uVar42 >> 0x13));
  lVar38 = uVar19 + uVar27 + ((uVar10 ^ uVar37) & uVar16 ^ uVar37) + 0x27b70a8546d22ffc +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar17 = uVar17 + lVar38;
  uVar21 = ((uVar40 | uVar36) & uVar25 | uVar40 & uVar36) +
           ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
           (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar38;
  uVar18 = (uVar29 >> 7 ^
           (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
           uVar8 + uVar22 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  lVar38 = uVar37 + uVar18 + ((uVar16 ^ uVar10) & uVar17 ^ uVar10) + 0x2e1b21385c26c926 +
           ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
           (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar25 = uVar25 + lVar38;
  uVar13 = ((uVar21 | uVar40) & uVar36 | uVar21 & uVar40) +
           ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
           (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar38;
  uVar20 = (uVar28 >> 7 ^
           (uVar28 << 0x38 | uVar28 >> 8) ^ (uVar28 >> 1 | (ulong)((uVar28 & 1) != 0) << 0x3f)) +
           uVar29 + uVar23 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  lVar38 = uVar10 + uVar20 + ((uVar17 ^ uVar16) & uVar25 ^ uVar16) + 0x4d2c6dfc5ac42aed +
           ((uVar25 * 0x800000 | uVar25 >> 0x29) ^
           (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe));
  uVar36 = uVar36 + lVar38;
  uVar31 = ((uVar13 | uVar21) & uVar40 | uVar13 & uVar21) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar24 = (uVar46 >> 7 ^
           (uVar46 << 0x38 | uVar46 >> 8) ^ (uVar46 >> 1 | (ulong)((uVar46 & 1) != 0) << 0x3f)) +
           uVar28 + uVar35 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  lVar38 = uVar16 + uVar24 + ((uVar25 ^ uVar17) & uVar36 ^ uVar17) + 0x53380d139d95b3df +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar40 = uVar40 + lVar38;
  uVar16 = ((uVar31 | uVar13) & uVar21 | uVar31 & uVar13) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar38;
  uVar8 = (uVar15 >> 7 ^
          (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
          uVar46 + uVar14 +
          (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  lVar38 = uVar17 + uVar8 + ((uVar36 ^ uVar25) & uVar40 ^ uVar25) + 0x650a73548baf63de +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar21 = uVar21 + lVar38;
  uVar17 = ((uVar16 | uVar31) & uVar13 | uVar16 & uVar31) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar29 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar15 + uVar42 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  lVar38 = uVar25 + uVar29 + ((uVar40 ^ uVar36) & uVar21 ^ uVar36) + 0x766a0abb3c77b2a8 +
           ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
           (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
  uVar13 = uVar13 + lVar38;
  uVar25 = ((uVar17 | uVar16) & uVar31 | uVar17 & uVar16) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar38;
  uVar26 = (uVar39 >> 7 ^
           (uVar39 << 0x38 | uVar39 >> 8) ^ (uVar39 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
           uVar11 + uVar34 +
           (uVar8 >> 6 ^ (uVar8 * 8 | uVar8 >> 0x3d) ^ (uVar8 << 0x2d | uVar8 >> 0x13));
  lVar38 = uVar36 + uVar26 + ((uVar21 ^ uVar40) & uVar13 ^ uVar40) + -0x7e3d36d1b812511a +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar31 = uVar31 + lVar38;
  uVar36 = ((uVar25 | uVar17) & uVar16 | uVar25 & uVar17) +
           ((uVar25 * 0x2000000 | uVar25 >> 0x27) ^
           (uVar25 * 0x40000000 | uVar25 >> 0x22) ^ (uVar25 << 0x24 | uVar25 >> 0x1c)) + lVar38;
  uVar10 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar39 + uVar27 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  lVar38 = uVar40 + uVar10 + ((uVar13 ^ uVar21) & uVar31 ^ uVar21) + -0x6d8dd37aeb7dcac5 +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar15 = ((uVar36 | uVar25) & uVar17 | uVar36 & uVar25) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar38;
  uVar39 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar12 + uVar18 +
           (uVar26 >> 6 ^ (uVar26 * 8 | uVar26 >> 0x3d) ^ (uVar26 << 0x2d | uVar26 >> 0x13));
  lVar38 = uVar21 + uVar39 + ((uVar31 ^ uVar13) & uVar16 ^ uVar13) + -0x5d40175eb30efc9c +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar17 = uVar17 + lVar38;
  uVar37 = ((uVar15 | uVar36) & uVar25 | uVar15 & uVar36) +
           ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
           (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar38;
  uVar28 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar30 + uVar20 +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  lVar38 = uVar13 + uVar28 + ((uVar16 ^ uVar31) & uVar17 ^ uVar31) + -0x57e599b443bdcfff +
           ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
           (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  uVar25 = uVar25 + lVar38;
  uVar40 = ((uVar37 | uVar15) & uVar36 | uVar37 & uVar15) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar11 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar22 + uVar24 +
           (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13));
  lVar38 = uVar31 + uVar11 + ((uVar17 ^ uVar16) & uVar25 ^ uVar16) + -0x3db4748f2f07686f +
           ((uVar25 * 0x800000 | uVar25 >> 0x29) ^
           (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe));
  uVar36 = uVar36 + lVar38;
  uVar9 = ((uVar40 | uVar37) & uVar15 | uVar40 & uVar37) +
          ((uVar40 * 0x2000000 | uVar40 >> 0x27) ^
          (uVar40 * 0x40000000 | uVar40 >> 0x22) ^ (uVar40 << 0x24 | uVar40 >> 0x1c)) + lVar38;
  uVar12 = (uVar35 >> 7 ^
           (uVar35 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
           uVar23 + uVar8 +
           (uVar28 >> 6 ^ (uVar28 * 8 | uVar28 >> 0x3d) ^ (uVar28 << 0x2d | uVar28 >> 0x13));
  lVar38 = uVar16 + uVar12 + ((uVar25 ^ uVar17) & uVar36 ^ uVar17) + -0x3893ae5cf9ab41d0 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar15 = uVar15 + lVar38;
  uVar13 = ((uVar9 | uVar40) & uVar37 | uVar9 & uVar40) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar38;
  uVar30 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar35 + uVar29 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  lVar38 = uVar17 + uVar30 + ((uVar36 ^ uVar25) & uVar15 ^ uVar25) + -0x2e6d17e62910ade8 +
           ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
           (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar21 = ((uVar13 | uVar9) & uVar40 | uVar13 & uVar9) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar23 = (uVar42 >> 7 ^
           (uVar42 << 0x38 | uVar42 >> 8) ^ (uVar42 >> 1 | (ulong)((uVar42 & 1) != 0) << 0x3f)) +
           uVar14 + uVar26 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  lVar38 = uVar25 + uVar23 + ((uVar15 ^ uVar36) & uVar37 ^ uVar36) + -0x2966f9dbaa9a56f0 +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar40 = uVar40 + lVar38;
  uVar16 = ((uVar21 | uVar13) & uVar9 | uVar21 & uVar13) +
           ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
           (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar38;
  uVar14 = (uVar34 >> 7 ^
           (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
           uVar42 + uVar10 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  lVar38 = uVar36 + uVar14 + ((uVar37 ^ uVar15) & uVar40 ^ uVar15) + -0xbf1ca7aa88edfd6 +
           ((uVar40 * 0x800000 | uVar40 >> 0x29) ^
           (uVar40 << 0x2e | uVar40 >> 0x12) ^ (uVar40 << 0x32 | uVar40 >> 0xe));
  uVar9 = uVar9 + lVar38;
  uVar31 = ((uVar16 | uVar21) & uVar13 | uVar16 & uVar21) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar35 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar34 + uVar39 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  lVar38 = uVar15 + uVar35 + ((uVar40 ^ uVar37) & uVar9 ^ uVar37) + 0x106aa07032bbd1b8 +
           ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
           (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar13 = uVar13 + lVar38;
  uVar32 = ((uVar31 | uVar16) & uVar21 | uVar31 & uVar16) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar38;
  uVar42 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           uVar27 + uVar28 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  lVar38 = uVar37 + uVar42 + ((uVar9 ^ uVar40) & uVar13 ^ uVar40) + 0x19a4c116b8d2d0c8 +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar21 = uVar21 + lVar38;
  uVar37 = ((uVar32 | uVar31) & uVar16 | uVar32 & uVar31) +
           ((uVar32 * 0x2000000 | uVar32 >> 0x27) ^
           (uVar32 * 0x40000000 | uVar32 >> 0x22) ^ (uVar32 << 0x24 | uVar32 >> 0x1c)) + lVar38;
  uVar27 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar18 + uVar11 +
           (uVar35 >> 6 ^ (uVar35 * 8 | uVar35 >> 0x3d) ^ (uVar35 << 0x2d | uVar35 >> 0x13));
  lVar38 = uVar40 + uVar27 + ((uVar13 ^ uVar9) & uVar21 ^ uVar9) + 0x1e376c085141ab53 +
           ((uVar21 * 0x800000 | uVar21 >> 0x29) ^
           (uVar21 << 0x2e | uVar21 >> 0x12) ^ (uVar21 << 0x32 | uVar21 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar15 = ((uVar37 | uVar32) & uVar31 | uVar37 & uVar32) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar19 = (uVar24 >> 7 ^
           (uVar24 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
           uVar20 + uVar12 +
           (uVar42 >> 6 ^ (uVar42 * 8 | uVar42 >> 0x3d) ^ (uVar42 << 0x2d | uVar42 >> 0x13));
  lVar38 = uVar9 + uVar19 + ((uVar21 ^ uVar13) & uVar16 ^ uVar13) + 0x2748774cdf8eeb99 +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar31 = uVar31 + lVar38;
  uVar36 = ((uVar15 | uVar37) & uVar32 | uVar15 & uVar37) +
           ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
           (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar38;
  uVar17 = (uVar8 >> 7 ^
           (uVar8 << 0x38 | uVar8 >> 8) ^ (uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f)) + uVar24
           + uVar30 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  lVar38 = uVar13 + uVar17 + ((uVar16 ^ uVar21) & uVar31 ^ uVar21) + 0x34b0bcb5e19b48a8 +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar32 = uVar32 + lVar38;
  uVar13 = ((uVar36 | uVar15) & uVar37 | uVar36 & uVar15) +
           ((uVar36 * 0x2000000 | uVar36 >> 0x27) ^
           (uVar36 * 0x40000000 | uVar36 >> 0x22) ^ (uVar36 << 0x24 | uVar36 >> 0x1c)) + lVar38;
  uVar9 = (uVar29 >> 7 ^
          (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
          uVar8 + uVar23 +
          (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  lVar38 = uVar21 + uVar9 + ((uVar31 ^ uVar16) & uVar32 ^ uVar16) + 0x391c0cb3c5c95a63 +
           ((uVar32 * 0x800000 | uVar32 >> 0x29) ^
           (uVar32 << 0x2e | uVar32 >> 0x12) ^ (uVar32 << 0x32 | uVar32 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar8 = ((uVar13 | uVar36) & uVar15 | uVar13 & uVar36) +
          ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
          (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar25 = (uVar26 >> 7 ^
           (uVar26 << 0x38 | uVar26 >> 8) ^ (uVar26 >> 1 | (ulong)((uVar26 & 1) != 0) << 0x3f)) +
           uVar29 + uVar14 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  lVar38 = uVar16 + uVar25 + ((uVar32 ^ uVar31) & uVar37 ^ uVar31) + 0x4ed8aa4ae3418acb +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar15 = uVar15 + lVar38;
  uVar29 = ((uVar8 | uVar13) & uVar36 | uVar8 & uVar13) +
           ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
           (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar38;
  uVar34 = (uVar10 >> 7 ^
           (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
           uVar26 + uVar35 +
           (uVar9 >> 6 ^ (uVar9 * 8 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13));
  lVar38 = uVar31 + uVar34 + ((uVar37 ^ uVar32) & uVar15 ^ uVar32) + 0x5b9cca4f7763e373 +
           ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
           (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
  uVar36 = uVar36 + lVar38;
  uVar22 = ((uVar29 | uVar8) & uVar13 | uVar29 & uVar8) +
           ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
           (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar38;
  uVar10 = (uVar39 >> 7 ^
           (uVar39 << 0x38 | uVar39 >> 8) ^ (uVar39 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
           uVar10 + uVar42 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  lVar38 = uVar32 + uVar10 + ((uVar15 ^ uVar37) & uVar36 ^ uVar37) + 0x682e6ff3d6b2b8a3 +
           ((uVar36 * 0x800000 | uVar36 >> 0x29) ^
           (uVar36 << 0x2e | uVar36 >> 0x12) ^ (uVar36 << 0x32 | uVar36 >> 0xe));
  uVar13 = uVar13 + lVar38;
  uVar24 = ((uVar22 | uVar29) & uVar8 | uVar22 & uVar29) +
           ((uVar22 * 0x2000000 | uVar22 >> 0x27) ^
           (uVar22 * 0x40000000 | uVar22 >> 0x22) ^ (uVar22 << 0x24 | uVar22 >> 0x1c)) + lVar38;
  uVar20 = (uVar28 >> 7 ^
           (uVar28 << 0x38 | uVar28 >> 8) ^ (uVar28 >> 1 | (ulong)((uVar28 & 1) != 0) << 0x3f)) +
           uVar39 + uVar27 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  lVar38 = uVar37 + uVar20 + ((uVar36 ^ uVar15) & uVar13 ^ uVar15) + 0x748f82ee5defb2fc +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar8 = uVar8 + lVar38;
  uVar37 = ((uVar24 | uVar22) & uVar29 | uVar24 & uVar22) +
           ((uVar24 * 0x2000000 | uVar24 >> 0x27) ^
           (uVar24 * 0x40000000 | uVar24 >> 0x22) ^ (uVar24 << 0x24 | uVar24 >> 0x1c)) + lVar38;
  uVar40 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar28 + uVar19 +
           (uVar10 >> 6 ^ (uVar10 * 8 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13));
  lVar38 = uVar15 + uVar40 + ((uVar13 ^ uVar36) & uVar8 ^ uVar36) + 0x78a5636f43172f60 +
           ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
           (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar29 = uVar29 + lVar38;
  uVar16 = ((uVar37 | uVar24) & uVar22 | uVar37 & uVar24) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar11 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar11 + uVar17 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  lVar38 = uVar36 + uVar11 + ((uVar8 ^ uVar13) & uVar29 ^ uVar13) + -0x7b3787eb5e0f548e +
           ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
           (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
  uVar22 = uVar22 + lVar38;
  uVar18 = ((uVar16 | uVar37) & uVar24 | uVar16 & uVar37) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar21 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar12 + uVar9 +
           (uVar40 >> 6 ^ (uVar40 * 8 | uVar40 >> 0x3d) ^ (uVar40 << 0x2d | uVar40 >> 0x13));
  lVar38 = uVar13 + uVar21 + ((uVar29 ^ uVar8) & uVar22 ^ uVar8) + -0x7338fdf7e59bc614 +
           ((uVar22 * 0x800000 | uVar22 >> 0x29) ^
           (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe));
  uVar24 = uVar24 + lVar38;
  uVar12 = ((uVar18 | uVar16) & uVar37 | uVar18 & uVar16) +
           ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
           (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar38;
  uVar36 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar30 + uVar25 +
           (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
  lVar38 = uVar8 + uVar36 + ((uVar22 ^ uVar29) & uVar24 ^ uVar29) + -0x6f410005dc9ce1d8 +
           ((uVar24 * 0x800000 | uVar24 >> 0x29) ^
           (uVar24 << 0x2e | uVar24 >> 0x12) ^ (uVar24 << 0x32 | uVar24 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar31 = ((uVar12 | uVar18) & uVar16 | uVar12 & uVar18) +
           ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
           (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar38;
  uVar39 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar23 + uVar34 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  lVar38 = uVar29 + uVar39 + ((uVar24 ^ uVar22) & uVar37 ^ uVar22) + -0x5baf9314217d4217 +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar29 = ((uVar31 | uVar12) & uVar18 | uVar31 & uVar12) +
           ((uVar31 * 0x2000000 | uVar31 >> 0x27) ^
           (uVar31 * 0x40000000 | uVar31 >> 0x22) ^ (uVar31 << 0x24 | uVar31 >> 0x1c)) + lVar38;
  uVar30 = (uVar35 >> 7 ^
           (uVar35 << 0x38 | uVar35 >> 8) ^ (uVar35 >> 1 | (ulong)((uVar35 & 1) != 0) << 0x3f)) +
           uVar14 + uVar10 +
           (uVar36 >> 6 ^ (uVar36 * 8 | uVar36 >> 0x3d) ^ (uVar36 << 0x2d | uVar36 >> 0x13));
  lVar38 = uVar22 + uVar30 + ((uVar37 ^ uVar24) & uVar16 ^ uVar24) + -0x41065c084d3986eb +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar18 = uVar18 + lVar38;
  uVar8 = ((uVar29 | uVar31) & uVar12 | uVar29 & uVar31) +
          ((uVar29 * 0x2000000 | uVar29 >> 0x27) ^
          (uVar29 * 0x40000000 | uVar29 >> 0x22) ^ (uVar29 << 0x24 | uVar29 >> 0x1c)) + lVar38;
  uVar14 = (uVar42 >> 7 ^
           (uVar42 << 0x38 | uVar42 >> 8) ^ (uVar42 >> 1 | (ulong)((uVar42 & 1) != 0) << 0x3f)) +
           uVar35 + uVar20 +
           (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13));
  lVar38 = uVar24 + uVar14 + ((uVar16 ^ uVar37) & uVar18 ^ uVar37) + -0x398e870d1c8dacd5 +
           ((uVar18 * 0x800000 | uVar18 >> 0x29) ^
           (uVar18 << 0x2e | uVar18 >> 0x12) ^ (uVar18 << 0x32 | uVar18 >> 0xe));
  uVar12 = uVar12 + lVar38;
  uVar22 = ((uVar8 | uVar29) & uVar31 | uVar8 & uVar29) +
           ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
           (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar38;
  uVar15 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar42 + uVar40 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  lVar38 = uVar37 + uVar15 + ((uVar18 ^ uVar16) & uVar12 ^ uVar16) + -0x35d8c13115d99e64 +
           ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
           (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
  uVar31 = uVar31 + lVar38;
  uVar13 = ((uVar22 | uVar8) & uVar29 | uVar22 & uVar8) +
           ((uVar22 * 0x2000000 | uVar22 >> 0x27) ^
           (uVar22 * 0x40000000 | uVar22 >> 0x22) ^ (uVar22 << 0x24 | uVar22 >> 0x1c)) + lVar38;
  uVar37 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar27 + uVar11 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  lVar38 = uVar16 + uVar37 + ((uVar12 ^ uVar18) & uVar31 ^ uVar18) + -0x2e794738de3f3df9 +
           ((uVar31 * 0x800000 | uVar31 >> 0x29) ^
           (uVar31 << 0x2e | uVar31 >> 0x12) ^ (uVar31 << 0x32 | uVar31 >> 0xe));
  uVar29 = uVar29 + lVar38;
  uVar42 = ((uVar13 | uVar22) & uVar8 | uVar13 & uVar22) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar19 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar19 + uVar21 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  lVar38 = uVar18 + uVar19 + ((uVar31 ^ uVar12) & uVar29 ^ uVar12) + -0x15258229321f14e2 +
           ((uVar29 * 0x800000 | uVar29 >> 0x29) ^
           (uVar29 << 0x2e | uVar29 >> 0x12) ^ (uVar29 << 0x32 | uVar29 >> 0xe));
  uVar8 = uVar8 + lVar38;
  uVar35 = ((uVar42 | uVar13) & uVar22 | uVar42 & uVar13) +
           ((uVar42 * 0x2000000 | uVar42 >> 0x27) ^
           (uVar42 * 0x40000000 | uVar42 >> 0x22) ^ (uVar42 << 0x24 | uVar42 >> 0x1c)) + lVar38;
  uVar17 = (uVar9 >> 7 ^
           (uVar9 << 0x38 | uVar9 >> 8) ^ (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f)) + uVar17
           + uVar36 +
           (uVar37 >> 6 ^ (uVar37 * 8 | uVar37 >> 0x3d) ^ (uVar37 << 0x2d | uVar37 >> 0x13));
  lVar38 = uVar12 + uVar17 + ((uVar29 ^ uVar31) & uVar8 ^ uVar31) + -0xa82b08011912e88 +
           ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
           (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar22 = uVar22 + lVar38;
  uVar12 = ((uVar35 | uVar42) & uVar13 | uVar35 & uVar42) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar38;
  uVar18 = (uVar25 >> 7 ^
           (uVar25 << 0x38 | uVar25 >> 8) ^ (uVar25 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar9 + uVar39 +
           (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  lVar38 = uVar31 + uVar18 + ((uVar8 ^ uVar29) & uVar22 ^ uVar29) + 0x6f067aa72176fba +
           ((uVar22 * 0x800000 | uVar22 >> 0x29) ^
           (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe));
  uVar13 = uVar13 + lVar38;
  uVar16 = ((uVar12 | uVar35) & uVar42 | uVar12 & uVar35) +
           ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
           (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar38;
  uVar25 = (uVar34 >> 7 ^
           (uVar34 << 0x38 | uVar34 >> 8) ^ (uVar34 >> 1 | (ulong)((uVar34 & 1) != 0) << 0x3f)) +
           uVar25 + uVar30 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  lVar38 = uVar29 + uVar25 + ((uVar22 ^ uVar8) & uVar13 ^ uVar8) + 0xa637dc5a2c898a6 +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar42 = uVar42 + lVar38;
  uVar27 = ((uVar16 | uVar12) & uVar35 | uVar16 & uVar12) +
           ((uVar16 * 0x2000000 | uVar16 >> 0x27) ^
           (uVar16 * 0x40000000 | uVar16 >> 0x22) ^ (uVar16 << 0x24 | uVar16 >> 0x1c)) + lVar38;
  uVar23 = (uVar10 >> 7 ^
           (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
           uVar34 + uVar14 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  lVar38 = uVar8 + uVar23 + ((uVar13 ^ uVar22) & uVar42 ^ uVar22) + 0x113f9804bef90dae +
           ((uVar42 * 0x800000 | uVar42 >> 0x29) ^
           (uVar42 << 0x2e | uVar42 >> 0x12) ^ (uVar42 << 0x32 | uVar42 >> 0xe));
  uVar35 = uVar35 + lVar38;
  uVar8 = ((uVar27 | uVar16) & uVar12 | uVar27 & uVar16) +
          ((uVar27 * 0x2000000 | uVar27 >> 0x27) ^
          (uVar27 * 0x40000000 | uVar27 >> 0x22) ^ (uVar27 << 0x24 | uVar27 >> 0x1c)) + lVar38;
  uVar31 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar10 + uVar15 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  lVar38 = uVar22 + uVar31 + ((uVar42 ^ uVar13) & uVar35 ^ uVar13) + 0x1b710b35131c471b +
           ((uVar35 * 0x800000 | uVar35 >> 0x29) ^
           (uVar35 << 0x2e | uVar35 >> 0x12) ^ (uVar35 << 0x32 | uVar35 >> 0xe));
  uVar12 = uVar12 + lVar38;
  uVar9 = ((uVar8 | uVar27) & uVar16 | uVar8 & uVar27) +
          ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
          (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar38;
  uVar29 = (uVar40 >> 7 ^
           (uVar40 << 0x38 | uVar40 >> 8) ^ (uVar40 >> 1 | (ulong)((uVar40 & 1) != 0) << 0x3f)) +
           uVar20 + uVar37 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  lVar38 = uVar13 + uVar29 + ((uVar35 ^ uVar42) & uVar12 ^ uVar42) + 0x28db77f523047d84 +
           ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
           (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
  uVar16 = uVar16 + lVar38;
  uVar37 = ((uVar9 | uVar8) & uVar27 | uVar9 & uVar8) +
           ((uVar9 * 0x2000000 | uVar9 >> 0x27) ^
           (uVar9 * 0x40000000 | uVar9 >> 0x22) ^ (uVar9 << 0x24 | uVar9 >> 0x1c)) + lVar38;
  uVar34 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar40 + uVar19 +
           (uVar31 >> 6 ^ (uVar31 * 8 | uVar31 >> 0x3d) ^ (uVar31 << 0x2d | uVar31 >> 0x13));
  lVar38 = uVar42 + uVar34 + ((uVar12 ^ uVar35) & uVar16 ^ uVar35) + 0x32caab7b40c72493 +
           ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
           (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
  uVar27 = uVar27 + lVar38;
  uVar13 = ((uVar37 | uVar9) & uVar8 | uVar37 & uVar9) +
           ((uVar37 * 0x2000000 | uVar37 >> 0x27) ^
           (uVar37 * 0x40000000 | uVar37 >> 0x22) ^ (uVar37 << 0x24 | uVar37 >> 0x1c)) + lVar38;
  uVar20 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar11 + uVar17 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  lVar38 = uVar35 + uVar20 + ((uVar16 ^ uVar12) & uVar27 ^ uVar12) + 0x3c9ebe0a15c9bebc +
           ((uVar27 * 0x800000 | uVar27 >> 0x29) ^
           (uVar27 << 0x2e | uVar27 >> 0x12) ^ (uVar27 << 0x32 | uVar27 >> 0xe));
  uVar8 = uVar8 + lVar38;
  uVar17 = ((uVar13 | uVar37) & uVar9 | uVar13 & uVar37) +
           ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
           (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c)) + lVar38;
  uVar34 = (uVar36 >> 7 ^
           (uVar36 << 0x38 | uVar36 >> 8) ^ (uVar36 >> 1 | (ulong)((uVar36 & 1) != 0) << 0x3f)) +
           uVar21 + uVar18 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  lVar38 = uVar12 + uVar34 + ((uVar27 ^ uVar16) & uVar8 ^ uVar16) + 0x431d67c49c100d4c +
           ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
           (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe));
  uVar9 = uVar9 + lVar38;
  uVar35 = ((uVar17 | uVar13) & uVar37 | uVar17 & uVar13) +
           ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
           (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar38;
  uVar42 = (uVar39 >> 7 ^
           (uVar39 << 0x38 | uVar39 >> 8) ^ (uVar39 >> 1 | (ulong)((uVar39 & 1) != 0) << 0x3f)) +
           uVar36 + uVar25 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  lVar38 = uVar16 + uVar42 + ((uVar8 ^ uVar27) & uVar9 ^ uVar27) + 0x4cc5d4becb3e42b6 +
           ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
           (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
  uVar37 = uVar37 + lVar38;
  uVar20 = ((uVar35 | uVar17) & uVar13 | uVar35 & uVar17) +
           ((uVar35 * 0x2000000 | uVar35 >> 0x27) ^
           (uVar35 * 0x40000000 | uVar35 >> 0x22) ^ (uVar35 << 0x24 | uVar35 >> 0x1c)) + lVar38;
  uVar39 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar39 + uVar23 +
           (uVar34 >> 6 ^ (uVar34 * 8 | uVar34 >> 0x3d) ^ (uVar34 << 0x2d | uVar34 >> 0x13));
  lVar38 = uVar27 + uVar39 + ((uVar9 ^ uVar8) & uVar37 ^ uVar8) + 0x597f299cfc657e2a +
           ((uVar37 * 0x800000 | uVar37 >> 0x29) ^
           (uVar37 << 0x2e | uVar37 >> 0x12) ^ (uVar37 << 0x32 | uVar37 >> 0xe));
  uVar13 = uVar13 + lVar38;
  uVar34 = ((uVar20 | uVar35) & uVar17 | uVar20 & uVar35) +
           ((uVar20 * 0x2000000 | uVar20 >> 0x27) ^
           (uVar20 * 0x40000000 | uVar20 >> 0x22) ^ (uVar20 << 0x24 | uVar20 >> 0x1c)) + lVar38;
  lVar38 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar30 + uVar31 +
           (uVar42 >> 6 ^ (uVar42 * 8 | uVar42 >> 0x3d) ^ (uVar42 << 0x2d | uVar42 >> 0x13)) + uVar8
           + ((uVar37 ^ uVar9) & uVar13 ^ uVar9) + 0x5fcb6fab3ad6faec +
           ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
           (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
  uVar17 = uVar17 + lVar38;
  uVar8 = ((uVar34 | uVar20) & uVar35 | uVar34 & uVar20) +
          ((uVar34 * 0x2000000 | uVar34 >> 0x27) ^
          (uVar34 * 0x40000000 | uVar34 >> 0x22) ^ (uVar34 << 0x24 | uVar34 >> 0x1c)) + lVar38;
  lVar38 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           uVar14 + uVar29 +
           (uVar39 >> 6 ^ (uVar39 * 8 | uVar39 >> 0x3d) ^ (uVar39 << 0x2d | uVar39 >> 0x13)) + uVar9
           + ((uVar13 ^ uVar37) & uVar17 ^ uVar37) + 0x6c44198c4a475817 +
           ((uVar17 * 0x800000 | uVar17 >> 0x29) ^
           (uVar17 << 0x2e | uVar17 >> 0x12) ^ (uVar17 << 0x32 | uVar17 >> 0xe));
  *s = ((uVar8 | uVar34) & uVar20 | uVar8 & uVar34) + uVar2 +
       ((uVar8 * 0x2000000 | uVar8 >> 0x27) ^
       (uVar8 * 0x40000000 | uVar8 >> 0x22) ^ (uVar8 << 0x24 | uVar8 >> 0x1c)) + lVar38;
  s[1] = uVar8 + uVar3;
  s[2] = uVar34 + uVar4;
  s[3] = uVar20 + s[3];
  s[4] = uVar35 + uVar5 + lVar38;
  s[5] = uVar17 + uVar6;
  s[6] = uVar13 + uVar7;
  s[7] = uVar37 + s[7];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint64_t* s, const unsigned char* chunk)
{
    uint64_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
    uint64_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98d728ae22ull, w0 = ReadBE64(chunk + 0));
    Round(h, a, b, c, d, e, f, g, 0x7137449123ef65cdull, w1 = ReadBE64(chunk + 8));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcfec4d3b2full, w2 = ReadBE64(chunk + 16));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba58189dbbcull, w3 = ReadBE64(chunk + 24));
    Round(e, f, g, h, a, b, c, d, 0x3956c25bf348b538ull, w4 = ReadBE64(chunk + 32));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1b605d019ull, w5 = ReadBE64(chunk + 40));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4af194f9bull, w6 = ReadBE64(chunk + 48));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5da6d8118ull, w7 = ReadBE64(chunk + 56));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98a3030242ull, w8 = ReadBE64(chunk + 64));
    Round(h, a, b, c, d, e, f, g, 0x12835b0145706fbeull, w9 = ReadBE64(chunk + 72));
    Round(g, h, a, b, c, d, e, f, 0x243185be4ee4b28cull, w10 = ReadBE64(chunk + 80));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3d5ffb4e2ull, w11 = ReadBE64(chunk + 88));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74f27b896full, w12 = ReadBE64(chunk + 96));
    Round(d, e, f, g, h, a, b, c, 0x80deb1fe3b1696b1ull, w13 = ReadBE64(chunk + 104));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a725c71235ull, w14 = ReadBE64(chunk + 112));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174cf692694ull, w15 = ReadBE64(chunk + 120));

    Round(a, b, c, d, e, f, g, h, 0xe49b69c19ef14ad2ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786384f25e3ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc68b8cd5b5ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x240ca1cc77ac9c65ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6f592b0275ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aa6ea6e483ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcbd41fbd4ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x76f988da831153b5ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ee66dfabull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa831c66d2db43210ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xb00327c898fb213full, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7beef0ee4ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf33da88fc2ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147930aa725ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351e003826full, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x142929670a0e6e70ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x27b70a8546d22ffcull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x2e1b21385c26c926ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc5ac42aedull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x53380d139d95b3dfull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x650a73548baf63deull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x766a0abb3c77b2a8ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92e47edaee6ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x92722c851482353bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a14cf10364ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bbc423001ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70d0f89791ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a30654be30ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xd192e819d6ef5218ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd69906245565a910ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xf40e35855771202aull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x106aa07032bbd1b8ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x19a4c116b8d2d0c8ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x1e376c085141ab53ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x2748774cdf8eeb99ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5e19b48a8ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3c5c95a63ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4ae3418acbull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4f7763e373ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3d6b2b8a3ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x748f82ee5defb2fcull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x78a5636f43172f60ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x84c87814a1f0ab72ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x8cc702081a6439ecull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x90befffa23631e28ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebde82bde9ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7b2c67915ull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2e372532bull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0xca273eceea26619cull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xd186b8c721c0c207ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0xeada7dd6cde0eb1eull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0xf57d4f7fee6ed178ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x06f067aa72176fbaull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x0a637dc5a2c898a6ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x113f9804bef90daeull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x1b710b35131c471bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x28db77f523047d84ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x32caab7b40c72493ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x3c9ebe0a15c9bebcull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x431d67c49c100d4cull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x4cc5d4becb3e42b6ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0x597f299cfc657e2aull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x5fcb6fab3ad6faecull, w14 + sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x6c44198c4a475817ull, w15 + sigma1(w13) + w8 + sigma0(w0));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
    s[5] += f;
    s[6] += g;
    s[7] += h;
}